

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O3

int maybe_new_socket(uv_tcp_t *handle,int domain,unsigned_long flags)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  uint flags_00;
  socklen_t slen;
  sockaddr_storage saddr;
  socklen_t local_ac;
  sockaddr local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  flags_00 = (uint)flags;
  if (domain != 0) {
    iVar2 = (handle->io_watcher).fd;
    if (iVar2 == -1) {
      iVar2 = uv__socket(domain,1,0);
      if (iVar2 < 0) {
        return iVar2;
      }
      iVar1 = uv__stream_open((uv_stream_t *)handle,iVar2,flags_00);
      if (iVar1 != 0) {
        uv__close(iVar2);
        return iVar1;
      }
      if ((flags_00 >> 0xd & 1) == 0) {
        return 0;
      }
      local_ac = 0x80;
      local_a8.sa_family = 0;
      local_a8.sa_data[0] = '\0';
      local_a8.sa_data[1] = '\0';
      local_a8.sa_data[2] = '\0';
      local_a8.sa_data[3] = '\0';
      local_a8.sa_data[4] = '\0';
      local_a8.sa_data[5] = '\0';
      local_a8.sa_data[6] = '\0';
      local_a8.sa_data[7] = '\0';
      local_a8.sa_data[8] = '\0';
      local_a8.sa_data[9] = '\0';
      local_a8.sa_data[10] = '\0';
      local_a8.sa_data[0xb] = '\0';
      local_a8.sa_data[0xc] = '\0';
      local_a8.sa_data[0xd] = '\0';
      local_98 = 0;
      uStack_90 = 0;
      local_88 = 0;
      uStack_80 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_58 = 0;
      uStack_50 = 0;
      local_48 = 0;
      uStack_40 = 0;
      local_38 = 0;
      uStack_30 = 0;
      iVar1 = getsockname((handle->io_watcher).fd,&local_a8,&local_ac);
      if ((iVar1 == 0) && (iVar1 = bind((handle->io_watcher).fd,&local_a8,local_ac), iVar1 == 0)) {
        return 0;
      }
      uv__close(iVar2);
LAB_0048e2aa:
      piVar3 = __errno_location();
      return -*piVar3;
    }
    if ((flags_00 >> 0xd & 1) != 0) {
      if ((handle->flags >> 0xd & 1) != 0) {
        handle->flags = handle->flags | flags_00;
        return 0;
      }
      local_ac = 0x80;
      local_a8.sa_family = 0;
      local_a8.sa_data[0] = '\0';
      local_a8.sa_data[1] = '\0';
      local_a8.sa_data[2] = '\0';
      local_a8.sa_data[3] = '\0';
      local_a8.sa_data[4] = '\0';
      local_a8.sa_data[5] = '\0';
      local_a8.sa_data[6] = '\0';
      local_a8.sa_data[7] = '\0';
      local_a8.sa_data[8] = '\0';
      local_a8.sa_data[9] = '\0';
      local_a8.sa_data[10] = '\0';
      local_a8.sa_data[0xb] = '\0';
      local_a8.sa_data[0xc] = '\0';
      local_a8.sa_data[0xd] = '\0';
      local_98 = 0;
      uStack_90 = 0;
      local_88 = 0;
      uStack_80 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_58 = 0;
      uStack_50 = 0;
      local_48 = 0;
      uStack_40 = 0;
      local_38 = 0;
      uStack_30 = 0;
      iVar2 = getsockname(iVar2,&local_a8,&local_ac);
      if ((iVar2 != 0) ||
         ((((local_a8.sa_family & 0xfff7) != 2 || (local_a8.sa_data._0_2_ == 0)) &&
          (iVar2 = bind((handle->io_watcher).fd,&local_a8,local_ac), iVar2 != 0))))
      goto LAB_0048e2aa;
    }
  }
  handle->flags = handle->flags | flags_00;
  return 0;
}

Assistant:

static int maybe_new_socket(uv_tcp_t* handle, int domain, unsigned long flags) {
  struct sockaddr_storage saddr;
  socklen_t slen;

  if (domain == AF_UNSPEC) {
    handle->flags |= flags;
    return 0;
  }

  if (uv__stream_fd(handle) != -1) {

    if (flags & UV_HANDLE_BOUND) {

      if (handle->flags & UV_HANDLE_BOUND) {
        /* It is already bound to a port. */
        handle->flags |= flags;
        return 0;
      }
      
      /* Query to see if tcp socket is bound. */
      slen = sizeof(saddr);
      memset(&saddr, 0, sizeof(saddr));
      if (getsockname(uv__stream_fd(handle), (struct sockaddr*) &saddr, &slen))
        return UV__ERR(errno);

      if ((saddr.ss_family == AF_INET6 &&
          ((struct sockaddr_in6*) &saddr)->sin6_port != 0) ||
          (saddr.ss_family == AF_INET &&
          ((struct sockaddr_in*) &saddr)->sin_port != 0)) {
        /* Handle is already bound to a port. */
        handle->flags |= flags;
        return 0;
      }

      /* Bind to arbitrary port */
      if (bind(uv__stream_fd(handle), (struct sockaddr*) &saddr, slen))
        return UV__ERR(errno);
    }

    handle->flags |= flags;
    return 0;
  }

  return new_socket(handle, domain, flags);
}